

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cn-create.c
# Opt level: O0

cn_cbor * cn_cbor_data_create(uint8_t *data,int len,cn_cbor_errback *errp)

{
  cn_cbor *ret;
  cn_cbor_errback *errp_local;
  int len_local;
  uint8_t *data_local;
  
  if (errp != (cn_cbor_errback *)0x0) {
    errp->err = CN_CBOR_NO_ERROR;
  }
  data_local = (uint8_t *)calloc(1,0x38);
  if (data_local == (uint8_t *)0x0) {
    if (errp != (cn_cbor_errback *)0x0) {
      errp->err = CN_CBOR_ERR_OUT_OF_MEMORY;
    }
    data_local = (uint8_t *)0x0;
  }
  else {
    data_local[0] = '\x06';
    data_local[1] = '\0';
    data_local[2] = '\0';
    data_local[3] = '\0';
    *(int *)(data_local + 0x10) = len;
    *(uint8_t **)(data_local + 8) = data;
  }
  return (cn_cbor *)data_local;
}

Assistant:

MYLIB_EXPORT
cn_cbor* cn_cbor_data_create(const uint8_t* data, int len
                             CBOR_CONTEXT,
                             cn_cbor_errback *errp)
{
  cn_cbor* ret;
  INIT_CB(ret);

  ret->type = CN_CBOR_BYTES;
  ret->length = len;
  ret->v.str = (const char*) data; // TODO: add v.ustr to the union?

  return ret;
}